

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<12>::Multiplicities::
print<std::back_insert_iterator<std::__cxx11::string>>
          (Multiplicities *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  TabulationRecord *pTVar1;
  PartialMultiplicity *entry;
  TabulationRecord *this_00;
  
  if ((this->total_).
      super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>.
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_engaged
      == true) {
    TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((TabulationRecord *)this,it,MAT,MF,MT);
  }
  pTVar1 = &((this->partials_).
             super__Vector_base<njoy::ENDFtk::section::Type<12>::PartialMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<12>::PartialMultiplicity>_>
             ._M_impl.super__Vector_impl_data._M_finish)->super_TabulationRecord;
  for (this_00 = &((this->partials_).
                   super__Vector_base<njoy::ENDFtk::section::Type<12>::PartialMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<12>::PartialMultiplicity>_>
                   ._M_impl.super__Vector_impl_data._M_start)->super_TabulationRecord;
      this_00 != pTVar1; this_00 = this_00 + 1) {
    TabulationRecord::print<std::back_insert_iterator<std::__cxx11::string>>(this_00,it,MAT,MF,MT);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  if ( this->total_ ) { this->total_->print( it, MAT, MF, MT ); }
  for ( const auto& entry : this->partials_ ) {

    entry.print( it, MAT, MF, MT );
  }
}